

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O3

bool __thiscall
crnlib::mipmapped_texture::crop(mipmapped_texture *this,uint x,uint y,uint width,uint height)

{
  void *p;
  vector<crnlib::mip_level_*> *pvVar1;
  bool bVar2;
  uint uVar3;
  image<crnlib::color_quad<unsigned_char,_int>_> *this_00;
  mip_level *pmVar4;
  long lVar5;
  ulong uVar6;
  face_vec faces;
  image_u8 tmp;
  face_vec local_88;
  image_u8 *local_70;
  image_u8 local_68;
  
  if (((this->m_faces).m_size == 1) && (height != 0 && width != 0)) {
    local_68.m_width = 0;
    local_68.m_height = 0;
    local_68.m_pitch = 0;
    local_68.m_total = 0;
    local_68.m_comp_flags = 0xf;
    local_68.m_pPixels = (color_quad<unsigned_char,_int> *)0x0;
    local_68.m_pixel_buf.m_p = (color_quad<unsigned_char,_int> *)0x0;
    local_68.m_pixel_buf.m_size = 0;
    local_68.m_pixel_buf.m_capacity = 0;
    local_70 = mip_level::get_unpacked_image(*((this->m_faces).m_p)->m_p,&local_68,3);
    this_00 = (image<crnlib::color_quad<unsigned_char,_int>_> *)crnlib_malloc(0x30);
    local_88.m_p = (vector<crnlib::mip_level_*> *)CONCAT44(local_88.m_p._4_4_,0xff000000);
    image<crnlib::color_quad<unsigned_char,_int>_>::image
              (this_00,width,height,0xffffffff,(color_quad<unsigned_char,_int> *)&local_88,0xf);
    bVar2 = image<crnlib::color_quad<unsigned_char,_int>_>::extract_block
                      (local_70,this_00->m_pPixels,x,y,width,height,false);
    if (bVar2) {
      local_88.m_p = (vector<crnlib::mip_level_*> *)0x0;
      local_88.m_size = 0;
      local_88.m_capacity = 0;
      elemental_vector::increase_capacity
                ((elemental_vector *)&local_88,1,true,0x10,(object_mover)0x0,false);
      if ((local_88._8_8_ & 0xffffffff) != 1) {
        memset(local_88.m_p + (local_88._8_8_ & 0xffffffff),0,(ulong)(1 - local_88.m_size) << 4);
      }
      pvVar1 = local_88.m_p;
      local_88.m_size = 1;
      if ((local_88.m_p)->m_size != 1) {
        if ((local_88.m_p)->m_size == 0) {
          uVar3 = 0;
          if ((local_88.m_p)->m_capacity == 0) {
            elemental_vector::increase_capacity
                      ((elemental_vector *)local_88.m_p,1,true,8,(object_mover)0x0,false);
            uVar3 = pvVar1->m_size;
          }
          memset(pvVar1->m_p + uVar3,0,(ulong)(1 - uVar3) << 3);
        }
        pvVar1->m_size = 1;
      }
      pmVar4 = (mip_level *)crnlib_malloc(0x28);
      pmVar4->m_width = 0;
      pmVar4->m_height = 0;
      pmVar4->m_comp_flags = cDefaultCompFlags;
      *(undefined8 *)&pmVar4->m_format = 0;
      *(undefined8 *)((long)&pmVar4->m_pImage + 4) = 0;
      *(undefined8 *)((long)&pmVar4->m_pDXTImage + 4) = 0;
      *(local_88.m_p)->m_p = pmVar4;
      this_00->m_comp_flags = local_70->m_comp_flags;
      mip_level::assign(*(local_88.m_p)->m_p,this_00,PIXEL_FMT_INVALID,cDefaultOrientationFlags);
      assign(this,&local_88);
      pvVar1 = local_88.m_p;
      if (local_88.m_p != (vector<crnlib::mip_level_*> *)0x0) {
        uVar6 = local_88._8_8_ & 0xffffffff;
        if (uVar6 != 0) {
          lVar5 = 0;
          do {
            p = *(void **)((long)&pvVar1->m_p + lVar5);
            if (p != (void *)0x0) {
              crnlib_free(p);
            }
            lVar5 = lVar5 + 0x10;
          } while (uVar6 << 4 != lVar5);
        }
        crnlib_free(local_88.m_p);
      }
    }
    if (local_68.m_pixel_buf.m_p != (color_quad<unsigned_char,_int> *)0x0) {
      crnlib_free(local_68.m_pixel_buf.m_p);
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool mipmapped_texture::crop(uint x, uint y, uint width, uint height) {
  CRNLIB_ASSERT(is_valid());
  if (!is_valid())
    return false;
  if (get_num_faces() > 1)
    return false;

  if ((width < 1) || (height < 1))
    return false;

  image_u8 tmp;
  image_u8* pImg = get_level(0, 0)->get_unpacked_image(tmp, cUnpackFlagUncook | cUnpackFlagUnflip);

  image_u8* pMip = crnlib_new<image_u8>(width, height);

  if (!pImg->extract_block(pMip->get_ptr(), x, y, width, height))
    return false;

  face_vec faces(1);
  faces[0].resize(1);
  faces[0][0] = crnlib_new<mip_level>();

  pMip->set_comp_flags(pImg->get_comp_flags());

  faces[0][0]->assign(pMip);

  assign(faces);

  CRNLIB_ASSERT(check());

  return true;
}